

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O3

bool __thiscall Render::loadResources(Render *this)

{
  int iVar1;
  Map *this_00;
  bool bVar2;
  undefined8 uVar3;
  SDL_Surface *pSVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  SDL_Rect r;
  
  uVar3 = SDL_RWFromFile("res/cs8x8.bmp","rb");
  pSVar4 = (SDL_Surface *)SDL_LoadBMP_RW(uVar3,1);
  this->charset = pSVar4;
  if (pSVar4 == (SDL_Surface *)0x0) {
    pcVar8 = "res/cs8x8.bmp";
  }
  else {
    SDL_SetColorKey(pSVar4,1,0);
    uVar3 = SDL_RWFromFile("res/tileset.bmp","rb");
    pSVar4 = (SDL_Surface *)SDL_LoadBMP_RW(uVar3,1);
    this->tileset = pSVar4;
    if (pSVar4 == (SDL_Surface *)0x0) {
      pcVar8 = "res/tileset.bmp";
    }
    else {
      SDL_SetColorKey(pSVar4,1,0);
      uVar3 = SDL_RWFromFile("res/drums.bmp","rb");
      pSVar4 = (SDL_Surface *)SDL_LoadBMP_RW(uVar3,1);
      this->backgroundTile = pSVar4;
      if (pSVar4 != (SDL_Surface *)0x0) {
        this_00 = this->map;
        iVar7 = this->screen->w / 2 + -0x138;
        this->startX = iVar7;
        this->startY = 0x28;
        iVar5 = this->screen->h;
        iVar6 = iVar5 + -0x28;
        iVar5 = iVar5 + -0x19;
        if (-1 < iVar6) {
          iVar5 = iVar6;
        }
        iVar6 = (iVar5 >> 4) + 1;
        this->rows = iVar6;
        (this->fieldBG).x = iVar7;
        (this->fieldBG).y = 0x28;
        (this->fieldBG).w = 0x270;
        iVar6 = iVar6 * 0x10;
        (this->fieldBG).h = iVar6;
        Map::setField(this_00,0x238,iVar6 + -0x10);
        pSVar4 = (SDL_Surface *)
                 SDL_CreateRGBSurface
                           (0,(this->fieldBG).w,(this->fieldBG).h,0x20,0xff0000,0xff00,0xff,
                            0xffffffffff000000);
        this->background = pSVar4;
        iVar6 = (this->fieldBG).w;
        pSVar4 = this->backgroundTile;
        if (-1 < iVar6 / pSVar4->w) {
          iVar5 = (this->fieldBG).h;
          iVar7 = 0;
          do {
            iVar1 = pSVar4->h;
            if (-1 < iVar5 / iVar1) {
              iVar6 = -1;
              do {
                iVar6 = iVar6 + 1;
                r.w = pSVar4->w;
                r.x = r.w * iVar7;
                r.y = iVar1 * iVar6;
                r.h = iVar1;
                SDL_UpperBlit(pSVar4,0,this->background,&r);
                iVar5 = (this->fieldBG).h;
                pSVar4 = this->backgroundTile;
                iVar1 = pSVar4->h;
              } while (iVar6 < iVar5 / iVar1);
              iVar6 = (this->fieldBG).w;
            }
            bVar2 = iVar7 < iVar6 / pSVar4->w;
            iVar7 = iVar7 + 1;
          } while (bVar2);
        }
        parseTileset(this,this->tileset);
        return true;
      }
      pcVar8 = "res/drums.bmp";
    }
  }
  printf("Cannot load: %s\n",pcVar8);
  return false;
}

Assistant:

bool Render::loadResources(){
    // ASCII Charset
    charset = SDL_LoadBMP(RESOURCE_CHARSET);
    if(!charset){
        printf("Cannot load: %s\n", RESOURCE_CHARSET);
        return false;
    }
    SDL_SetColorKey(charset, true, 0x000000);

    // Tileset
    tileset = SDL_LoadBMP(RESOURCE_TILESET);
    if(!tileset){
        printf("Cannot load: %s\n", RESOURCE_TILESET);
        return false;
    }
    SDL_SetColorKey(tileset, true, 0x000000);

    // Background Tile
    backgroundTile = SDL_LoadBMP(RESOURCE_BACKGROUND);
    if(!backgroundTile){
        printf("Cannot load: %s\n", RESOURCE_BACKGROUND);
        return false;
    }

    // Calculate variables
    startX = screen->w/2 - ((BLOCKS_W+2)*BLOCK_W)/2;
    startY = 40;
    rows = (screen->h - startY)/BLOCK_H + 1;
    fieldBG.x = startX;
    fieldBG.y = startY;
    fieldBG.w = (BLOCKS_W+2)*BLOCK_W;
    fieldBG.h = (rows)*BLOCK_H;
    map->setField(fieldBG.w - 2*BLOCK_W - BALL_W, fieldBG.h - BLOCK_H);

    // Pre-render background
    SDL_Rect r;
    background = SDL_CreateRGBSurface(0, fieldBG.w, fieldBG.h, 32, 0x00FF0000, 0x0000FF00, 0x000000FF, 0xFF000000);
    for(int i=0; i<(fieldBG.w/backgroundTile->w + 1); i++)
        for(int j=0; j<(fieldBG.h/backgroundTile->h +1); j++){
            r.x = i*backgroundTile->w;
            r.y = j*backgroundTile->h;
            r.w = backgroundTile->w;
            r.h = backgroundTile->h;
            SDL_BlitSurface(backgroundTile, nullptr, background, &r);
        }

    parseTileset(tileset);

    return true;
}